

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O2

void copyPixels(string *type,MultiPartInputFile *inputFile,MultiPartOutputFile *outputFile,
               int inputPartNumber,int outputPartNumber)

{
  __type _Var1;
  
  _Var1 = std::operator==(type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               Imf_3_4::SCANLINEIMAGE_abi_cxx11_);
  if (_Var1) {
    copyPixels<Imf_3_4::InputPart,Imf_3_4::OutputPart>
              (inputFile,outputFile,inputPartNumber,outputPartNumber);
    return;
  }
  _Var1 = std::operator==(type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               Imf_3_4::TILEDIMAGE_abi_cxx11_);
  if (_Var1) {
    copyPixels<Imf_3_4::TiledInputPart,Imf_3_4::TiledOutputPart>
              (inputFile,outputFile,inputPartNumber,outputPartNumber);
    return;
  }
  _Var1 = std::operator==(type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               Imf_3_4::DEEPSCANLINE_abi_cxx11_);
  if (_Var1) {
    copyPixels<Imf_3_4::DeepScanLineInputPart,Imf_3_4::DeepScanLineOutputPart>
              (inputFile,outputFile,inputPartNumber,outputPartNumber);
    return;
  }
  _Var1 = std::operator==(type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               Imf_3_4::DEEPTILE_abi_cxx11_);
  if (_Var1) {
    copyPixels<Imf_3_4::DeepTiledInputPart,Imf_3_4::DeepTiledOutputPart>
              (inputFile,outputFile,inputPartNumber,outputPartNumber);
    return;
  }
  return;
}

Assistant:

void
copyPixels (
    const std::string&   type,
    MultiPartInputFile&  inputFile,
    MultiPartOutputFile& outputFile,
    int                  inputPartNumber,
    int                  outputPartNumber)
{
    //
    // Copy pixels from a given part of a multipart input file
    // to a given part of a multipart output file.
    //

    if (type == SCANLINEIMAGE)
    {
        copyPixels<InputPart, OutputPart> (
            inputFile, outputFile, inputPartNumber, outputPartNumber);
    }
    else if (type == TILEDIMAGE)
    {
        copyPixels<TiledInputPart, TiledOutputPart> (
            inputFile, outputFile, inputPartNumber, outputPartNumber);
    }
    else if (type == DEEPSCANLINE)
    {
        copyPixels<DeepScanLineInputPart, DeepScanLineOutputPart> (
            inputFile, outputFile, inputPartNumber, outputPartNumber);
    }
    else if (type == DEEPTILE)
    {
        copyPixels<DeepTiledInputPart, DeepTiledOutputPart> (
            inputFile, outputFile, inputPartNumber, outputPartNumber);
    }
}